

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void build_chk2_cmp2(m68k_info *info,int size)

{
  ulong uVar1;
  uint Op;
  uint uVar2;
  
  MCInst_setOpcode(info->inst,0x2e);
  (info->extension).op_count = '\x02';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1.cpu_size = size;
  uVar1 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  uVar2 = 0xaaaa;
  if (uVar1 + 2 <= info->code_len) {
    uVar2 = (uint)(ushort)(*(ushort *)(info->code + uVar1) << 8 |
                          *(ushort *)(info->code + uVar1) >> 8);
  }
  info->pc = info->pc + 2;
  Op = 0x2e;
  if ((uVar2 >> 0xb & 1) == 0) {
    Op = 0x34;
  }
  MCInst_setOpcode(info->inst,Op);
  get_ea_mode_op(info,(info->extension).operands,info->ir,size);
  (info->extension).operands[1].type = M68K_OP_REG;
  (info->extension).operands[1].address_mode = M68K_AM_NONE;
  (info->extension).operands[1].field_0.reg =
       (uVar2 >> 0xc & 7) + (uint)(0x7fff < uVar2) * 8 + M68K_REG_D0;
  return;
}

Assistant:

static void build_chk2_cmp2(m68k_info *info, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k* ext = build_init_op(info, M68K_INS_CHK2, 2, size);

	uint extension = read_imm_16(info);

	if (BIT_B(extension))
		MCInst_setOpcode(info->inst, M68K_INS_CHK2);
	else
		MCInst_setOpcode(info->inst, M68K_INS_CMP2);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	get_ea_mode_op(info, op0, info->ir, size);

	op1->address_mode = M68K_AM_NONE;
	op1->type = M68K_OP_REG;
	op1->reg = (BIT_F(extension) ? M68K_REG_A0 : M68K_REG_D0) + ((extension >> 12) & 7);
}